

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

string * __thiscall
flatbuffers::java::JavaGenerator::DestinationCast_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type)

{
  bool bVar1;
  allocator<char> local_55 [20];
  allocator<char> local_41;
  Type local_40;
  Type *local_20;
  Type *type_local;
  JavaGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (JavaGenerator *)__return_storage_ptr__;
  bVar1 = IsSeries(type);
  if (bVar1) {
    Type::VectorType(&local_40,local_20);
    DestinationCast_abi_cxx11_(__return_storage_ptr__,this,&local_40);
  }
  else if (local_20->base_type == BASE_TYPE_UINT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(long)",&local_41);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_55)
    ;
    std::allocator<char>::~allocator(local_55);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DestinationCast(const Type &type) const {
    if (IsSeries(type)) {
      return DestinationCast(type.VectorType());
    } else {
      // Cast necessary to correctly read serialized unsigned values.
      if (type.base_type == BASE_TYPE_UINT) return "(long)";
    }
    return "";
  }